

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_div_q_2exp(__mpz_struct *q,__mpz_struct *u,mp_bitcnt_t bit_index,mpz_div_round_mode mode)

{
  uint uVar1;
  mp_srcptr rp;
  int iVar2;
  mp_ptr d;
  ulong n;
  ulong size;
  uint uVar3;
  bool bVar4;
  
  uVar1 = u->_mp_size;
  if (uVar1 == 0) {
    q->_mp_size = 0;
    return;
  }
  n = bit_index >> 6;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  size = uVar3 - n;
  uVar3 = (uint)bit_index & 0x3f;
  if (0 < (int)uVar1 == mode) {
    if (0 < (long)size) {
      rp = u->_mp_d;
      iVar2 = mpn_zero_p(rp,n);
      if (iVar2 == 0) {
        bVar4 = false;
      }
      else {
        bVar4 = (rp[n] & ~(-1L << (sbyte)uVar3)) == 0;
      }
      goto LAB_0049ce05;
    }
    q->_mp_size = 0;
  }
  else {
    bVar4 = true;
    if ((long)size < 1) {
      q->_mp_size = 0;
      goto LAB_0049ce74;
    }
LAB_0049ce05:
    if ((long)q->_mp_alloc < (long)size) {
      d = mpz_realloc(q,size);
    }
    else {
      d = q->_mp_d;
    }
    if ((bit_index & 0x3f) == 0) {
      mpn_copyi(d,u->_mp_d + n,size);
    }
    else {
      mpn_rshift(d,u->_mp_d + n,size,uVar3);
      size = (ulong)((int)size - (uint)(d[size - 1] == 0));
    }
    q->_mp_size = (int)size;
    if (bVar4) goto LAB_0049ce74;
  }
  mpz_add_ui(q,q,1);
LAB_0049ce74:
  if (-1 < (int)uVar1) {
    return;
  }
  mpz_neg(q,q);
  return;
}

Assistant:

static void
mpz_div_q_2exp (mpz_t q, const mpz_t u, mp_bitcnt_t bit_index,
		enum mpz_div_round_mode mode)
{
  mp_size_t un, qn;
  mp_size_t limb_cnt;
  mp_ptr qp;
  int adjust;

  un = u->_mp_size;
  if (un == 0)
    {
      q->_mp_size = 0;
      return;
    }
  limb_cnt = bit_index / GMP_LIMB_BITS;
  qn = GMP_ABS (un) - limb_cnt;
  bit_index %= GMP_LIMB_BITS;

  if (mode == ((un > 0) ? GMP_DIV_CEIL : GMP_DIV_FLOOR)) /* un != 0 here. */
    /* Note: Below, the final indexing at limb_cnt is valid because at
       that point we have qn > 0. */
    adjust = (qn <= 0
	      || !mpn_zero_p (u->_mp_d, limb_cnt)
	      || (u->_mp_d[limb_cnt]
		  & (((mp_limb_t) 1 << bit_index) - 1)));
  else
    adjust = 0;

  if (qn <= 0)
    qn = 0;
  else
    {
      qp = MPZ_REALLOC (q, qn);

      if (bit_index != 0)
	{
	  mpn_rshift (qp, u->_mp_d + limb_cnt, qn, bit_index);
	  qn -= qp[qn - 1] == 0;
	}
      else
	{
	  mpn_copyi (qp, u->_mp_d + limb_cnt, qn);
	}
    }

  q->_mp_size = qn;

  if (adjust)
    mpz_add_ui (q, q, 1);
  if (un < 0)
    mpz_neg (q, q);
}